

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall ON_SimpleArray<ON_Curve_*>::Reverse(ON_SimpleArray<ON_Curve_*> *this)

{
  ON_Curve **ppOVar1;
  ON_Curve *pOVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)this->m_count;
  for (lVar4 = 0; lVar3 = lVar3 + -1, lVar4 < lVar3; lVar4 = lVar4 + 1) {
    ppOVar1 = this->m_a;
    pOVar2 = ppOVar1[lVar4];
    ppOVar1[lVar4] = ppOVar1[lVar3];
    this->m_a[lVar3] = pOVar2;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Reverse()
{
  // NOTE:
  // If anything in "T" depends on the value of this's address,
  // then don't call Reverse().
  T t;
  int i = 0;  
  int j = m_count-1;
  for ( /*empty*/; i < j; i++, j-- ) {
    t = m_a[i];
    m_a[i] = m_a[j];
    m_a[j] = t;
  }
}